

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferPointer
          (EpsCopyOutputStream *this,void **data,int *size,uint8 **pp)

{
  uint uVar1;
  uint8 *puVar2;
  bool bVar3;
  int iVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  
  if (this->had_error_ != true) {
    iVar4 = Flush(this,*pp);
    *size = iVar4;
    if (this->had_error_ != true) {
      *data = this->buffer_end_;
      do {
        uVar1 = *size;
        if ((ulong)uVar1 != 0) {
          puVar2 = (uint8 *)*data;
          puVar5 = (uint8 *)0x0;
          puVar6 = puVar2 + ((ulong)uVar1 - 0x10);
          if ((int)uVar1 < 0x11) {
            puVar5 = puVar2;
            puVar6 = this->buffer_ + (int)uVar1;
          }
          this->end_ = puVar6;
          this->buffer_end_ = puVar5;
          puVar6 = this->buffer_;
          if (0x10 < (int)uVar1) {
            puVar6 = puVar2;
          }
          bVar3 = true;
          goto LAB_0016b2ec;
        }
        iVar4 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,data,size);
      } while ((char)iVar4 != '\0');
      this->had_error_ = true;
      this->end_ = this->buffer_ + 0x10;
    }
  }
  puVar6 = this->buffer_;
  bVar3 = false;
LAB_0016b2ec:
  *pp = puVar6;
  return bVar3;
}

Assistant:

bool EpsCopyOutputStream::GetDirectBufferPointer(void** data, int* size,
                                                 uint8** pp) {
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *data = buffer_end_;
  while (*size == 0) {
    if (!stream_->Next(data, size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(*data, *size);
  return true;
}